

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
* tinyusdz::tydra::GetBlendShapes
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
             *__return_storage_ptr__,Stage *stage,Prim *prim,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  long lVar4;
  bool bVar5;
  byte bVar6;
  GeomMesh *pGVar7;
  BlendShape *pBVar8;
  string *psVar9;
  ulong uVar10;
  Path *pPVar11;
  long lVar12;
  Prim *bsprim;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  dst;
  Prim *local_e0;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_d8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  *local_c0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  local_b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>
  local_a0;
  Stage *local_78;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  local_b8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pGVar7 = tinyusdz::value::Value::as<tinyusdz::GeomMesh>(&prim->_data,false);
  if (pGVar7 == (GeomMesh *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    (__return_storage_ptr__->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    goto LAB_0031fcda;
  }
  if ((pGVar7->blendShapes)._attrib.has_value_ == false) {
    if (((pGVar7->blendShapes)._paths.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_finish ==
         (pGVar7->blendShapes)._paths.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_start) && ((pGVar7->blendShapes)._value_empty == false)) {
      if (((pGVar7->blendShapes)._blocked != false) &&
         ((pGVar7->blendShapeTargets).has_value_ == true)) {
LAB_0031fae5:
        local_d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        goto joined_r0x0031faf9;
      }
    }
    else if ((pGVar7->blendShapeTargets).has_value_ != false) goto LAB_0031fae5;
LAB_0031fb0e:
    local_b8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    local_b8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    local_b8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    local_b8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    local_b8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0031fb10:
    *(undefined4 *)
     &(__return_storage_ptr__->
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
      )._M_impl.super__Vector_impl_data._M_start =
         local_b8.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
         ._M_impl.super__Vector_impl_data._M_start._0_4_;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 4) =
         local_b8.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
         ._M_impl.super__Vector_impl_data._M_start._4_4_;
    *(undefined4 *)
     &(__return_storage_ptr__->
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
      )._M_impl.super__Vector_impl_data._M_finish =
         local_b8.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_4_;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
             )._M_impl.super__Vector_impl_data._M_finish + 4) =
         local_b8.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._4_4_;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_b8.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_b8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    goto LAB_0031fcda;
  }
  if ((pGVar7->blendShapeTargets).has_value_ == false) goto LAB_0031fb0e;
  local_d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
            (&local_d8,
             (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
             &(pGVar7->blendShapes)._attrib.contained);
  bVar6 = (pGVar7->blendShapeTargets).has_value_;
  if ((bool)bVar6 == false) goto LAB_0031fc81;
  iVar2 = *(int *)&(pGVar7->blendShapeTargets).contained;
  if (iVar2 == 2) {
    if ((long)local_d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)local_d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
              .super__Vector_impl_data._M_start >> 5 ==
        (*(long *)((long)&(pGVar7->blendShapeTargets).contained + 0xe0) -
         *(long *)((long)&(pGVar7->blendShapeTargets).contained + 0xd8) >> 4) * 0x4ec4ec4ec4ec4ec5)
    {
LAB_0031fb7d:
      local_c0 = __return_storage_ptr__;
      local_78 = stage;
      if ((bVar6 & 1) != 0) {
        uVar10 = 0xffffffffffffffff;
        lVar12 = 0;
        do {
          lVar4 = *(long *)((long)&(pGVar7->blendShapeTargets).contained + 0xd8);
          uVar10 = uVar10 + 1;
          if ((ulong)((*(long *)((long)&(pGVar7->blendShapeTargets).contained + 0xe0) - lVar4 >> 4)
                     * 0x4ec4ec4ec4ec4ec5) <= uVar10) {
            ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                      ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_d8);
            __return_storage_ptr__ = local_c0;
            goto LAB_0031fb10;
          }
          pPVar11 = (Path *)(lVar4 + lVar12);
          local_e0 = (Prim *)0x0;
          psVar9 = err;
          bVar5 = Stage::find_prim_at_path(local_78,pPVar11,&local_e0,err);
          __return_storage_ptr__ = local_c0;
          if (!bVar5) goto LAB_0031fcc5;
          if (local_e0 == (Prim *)0x0) {
            if (err != (string *)0x0) {
              ::std::__cxx11::string::append((char *)err);
              __return_storage_ptr__ = local_c0;
            }
            goto LAB_0031fcc5;
          }
          pBVar8 = tinyusdz::value::Value::as<tinyusdz::BlendShape>(&local_e0->_data,false);
          if (pBVar8 == (BlendShape *)0x0) {
            __return_storage_ptr__ = local_c0;
            if (err != (string *)0x0) {
              local_70[0] = local_60;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_70,"{} is not BlendShape Prim.","");
              Path::full_path_name_abi_cxx11_(&local_50,pPVar11);
              fmt::format<std::__cxx11::string>
                        ((string *)&local_a0,(fmt *)local_70,(string *)&local_50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar9
                        );
              ::std::__cxx11::string::_M_append((char *)err,(ulong)local_a0.first._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
                operator_delete(local_a0.first._M_dataplus._M_p,
                                local_a0.first.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              __return_storage_ptr__ = local_c0;
              if (local_70[0] != local_60) {
                operator_delete(local_70[0],local_60[0] + 1);
                __return_storage_ptr__ = local_c0;
              }
            }
            goto LAB_0031fcc5;
          }
          paVar1 = &local_a0.first.field_2;
          pcVar3 = ((local_d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                     _M_impl.super__Vector_impl_data._M_start)->str_)._M_dataplus._M_p;
          local_a0.first._M_dataplus._M_p = (pointer)paVar1;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,pcVar3,
                     pcVar3 + ((local_d8.
                                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                ._M_impl.super__Vector_impl_data._M_start)->str_)._M_string_length);
          local_a0.second = pBVar8;
          ::std::
          vector<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>,std::allocator<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>>>
          ::emplace_back<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>>
                    ((vector<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>,std::allocator<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>>>
                      *)&local_b8,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0.first._M_dataplus._M_p,
                            local_a0.first.field_2._M_allocated_capacity + 1);
          }
          lVar12 = lVar12 + 0xd0;
        } while ((pGVar7->blendShapeTargets).has_value_ != false);
      }
LAB_0031fc81:
      __assert_fail("has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                    ,0x584,
                    "const value_type &nonstd::optional_lite::optional<tinyusdz::Relationship>::value() const [T = tinyusdz::Relationship]"
                   );
    }
joined_r0x0031faf9:
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
  }
  else {
    if ((iVar2 != 1) ||
       ((long)local_d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)local_d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
              .super__Vector_impl_data._M_start != 0x20)) goto joined_r0x0031faf9;
    pPVar11 = (Path *)((long)&(pGVar7->blendShapeTargets).contained + 8);
    local_e0 = (Prim *)0x0;
    psVar9 = err;
    bVar5 = Stage::find_prim_at_path(stage,pPVar11,&local_e0,err);
    if (bVar5) {
      if (local_e0 == (Prim *)0x0) goto joined_r0x0031faf9;
      pBVar8 = tinyusdz::value::Value::as<tinyusdz::BlendShape>(&local_e0->_data,false);
      if (pBVar8 != (BlendShape *)0x0) {
        paVar1 = &local_a0.first.field_2;
        pcVar3 = ((local_d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start)->str_)._M_dataplus._M_p;
        local_a0.first._M_dataplus._M_p = (pointer)paVar1;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,pcVar3,
                   pcVar3 + ((local_d8.
                              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                              _M_impl.super__Vector_impl_data._M_start)->str_)._M_string_length);
        local_a0.second = pBVar8;
        ::std::
        vector<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>,std::allocator<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>>>
        ::emplace_back<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>>
                  ((vector<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>,std::allocator<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>>>
                    *)&local_b8,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0.first._M_dataplus._M_p,
                          local_a0.first.field_2._M_allocated_capacity + 1);
        }
        bVar6 = (pGVar7->blendShapeTargets).has_value_;
        goto LAB_0031fb7d;
      }
      if (err != (string *)0x0) {
        local_70[0] = local_60;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_70,"{} is not BlendShape Prim.\n","");
        Path::full_path_name_abi_cxx11_(&local_50,pPVar11);
        fmt::format<std::__cxx11::string>
                  ((string *)&local_a0,(fmt *)local_70,(string *)&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar9);
        ::std::__cxx11::string::_M_append((char *)err,(ulong)local_a0.first._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
          operator_delete(local_a0.first._M_dataplus._M_p,
                          local_a0.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
      }
    }
  }
LAB_0031fcc5:
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_d8);
LAB_0031fcda:
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  ::~vector(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<std::string, const tinyusdz::BlendShape *>>
GetBlendShapes(const tinyusdz::Stage &stage, const tinyusdz::Prim &prim,
               std::string *err) {
  std::vector<std::pair<std::string, const tinyusdz::BlendShape *>> dst;

  auto *pmesh = prim.as<GeomMesh>();
  if (!pmesh) {
    if (err) {
      (*err) += "Prim must be GeomMesh.\n";
    }
    return std::vector<std::pair<std::string, const tinyusdz::BlendShape *>>{};
  }

  //
  // BlendShape Prim may not be a child of GeomMesh. So need to search Prim in
  // Stage
  //
  if (pmesh->blendShapes.authored() && pmesh->blendShapeTargets.has_value()) {
    // TODO: connection?
    std::vector<value::token> blendShapeNames;

    if (!pmesh->blendShapes.get_value(&blendShapeNames)) {
      if (err) {
        (*err) += "Failed to get `skel:blendShapes` attribute.\n";
      }
      return std::vector<
          std::pair<std::string, const tinyusdz::BlendShape *>>{};
    }

    if (pmesh->blendShapeTargets.value().is_path()) {
      if (blendShapeNames.size() != 1) {
        if (err) {
          (*err) +=
              "Array size mismatch with `skel:blendShapes` and "
              "`skel:blendShapeTargets`.\n";
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }

      const Path &targetPath = pmesh->blendShapeTargets.value().targetPath;
      const Prim *bsprim{nullptr};
      if (!stage.find_prim_at_path(targetPath, bsprim, err)) {
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }
      if (!bsprim) {
        if (err) {
          (*err) += "Internal error. BlendShape Prim is nullptr.\n";
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }

      if (const auto *bs = bsprim->as<BlendShape>()) {
        dst.push_back(std::make_pair(blendShapeNames[0].str(), bs));
      } else {
        if (err) {
          (*err) += fmt::format("{} is not BlendShape Prim.\n",
                                targetPath.full_path_name());
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }

    } else if (pmesh->blendShapeTargets.value().is_pathvector()) {
      if (blendShapeNames.size() !=
          pmesh->blendShapeTargets.value().targetPathVector.size()) {
        if (err) {
          (*err) +=
              "Array size mismatch with `skel:blendShapes` and "
              "`skel:blendShapeTargets`.\n";
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }
    } else {
      if (err) {
        (*err) +=
            "Invalid or unsupported definition of `skel:blendShapeTargets` "
            "relationship.\n";
      }
      return std::vector<
          std::pair<std::string, const tinyusdz::BlendShape *>>{};
    }

    for (size_t i = 0;
         i < pmesh->blendShapeTargets.value().targetPathVector.size(); i++) {
      const Path &targetPath =
          pmesh->blendShapeTargets.value().targetPathVector[i];
      const Prim *bsprim{nullptr};
      if (!stage.find_prim_at_path(targetPath, bsprim, err)) {
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }
      if (!bsprim) {
        if (err) {
          (*err) += "Internal error. BlendShape Prim is nullptr.";
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }

      if (const auto *bs = bsprim->as<BlendShape>()) {
        dst.push_back(std::make_pair(blendShapeNames[0].str(), bs));
      } else {
        if (err) {
          (*err) += fmt::format("{} is not BlendShape Prim.",
                                targetPath.full_path_name());
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }
    }
  }

  return dst;
}